

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc_sse2.c
# Opt level: O1

int QuantizeBlockWHT_SSE2(int16_t *in,int16_t *out,VP8Matrix *mtx)

{
  int16_t iVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  unkbyte10 Var10;
  unkbyte10 Var11;
  int iVar12;
  int iVar13;
  short sVar14;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar15 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  int iVar28;
  short sVar36;
  undefined1 auVar30 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar37;
  short sVar41;
  undefined1 auVar39 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar29 [12];
  undefined1 auVar31 [16];
  undefined1 auVar38 [12];
  undefined1 auVar40 [16];
  
  auVar15 = *(undefined1 (*) [16])in;
  auVar23 = *(undefined1 (*) [16])(in + 8);
  auVar25 = *(undefined1 (*) [16])mtx->iq_;
  auVar33 = *(undefined1 (*) [16])(mtx->iq_ + 8);
  sVar14 = auVar15._0_2_;
  sVar36 = -sVar14;
  sVar16 = auVar15._2_2_;
  sVar41 = -sVar16;
  sVar17 = auVar15._4_2_;
  sVar2 = -sVar17;
  sVar18 = auVar15._6_2_;
  sVar3 = -sVar18;
  sVar19 = auVar15._8_2_;
  sVar4 = -sVar19;
  sVar20 = auVar15._10_2_;
  sVar5 = -sVar20;
  sVar21 = auVar15._12_2_;
  sVar6 = -sVar21;
  sVar22 = auVar15._14_2_;
  sVar7 = -sVar22;
  auVar30._0_2_ = (ushort)(sVar36 < sVar14) * sVar14 | (ushort)(sVar36 >= sVar14) * sVar36;
  auVar30._2_2_ = (ushort)(sVar41 < sVar16) * sVar16 | (ushort)(sVar41 >= sVar16) * sVar41;
  auVar30._4_2_ = (ushort)(sVar2 < sVar17) * sVar17 | (ushort)(sVar2 >= sVar17) * sVar2;
  auVar30._6_2_ = (ushort)(sVar3 < sVar18) * sVar18 | (ushort)(sVar3 >= sVar18) * sVar3;
  auVar30._8_2_ = (ushort)(sVar4 < sVar19) * sVar19 | (ushort)(sVar4 >= sVar19) * sVar4;
  auVar30._10_2_ = (ushort)(sVar5 < sVar20) * sVar20 | (ushort)(sVar5 >= sVar20) * sVar5;
  auVar30._12_2_ = (ushort)(sVar6 < sVar21) * sVar21 | (ushort)(sVar6 >= sVar21) * sVar6;
  auVar30._14_2_ = (ushort)(sVar7 < sVar22) * sVar22 | (ushort)(sVar7 >= sVar22) * sVar7;
  auVar15 = psraw(auVar15,0xf);
  sVar14 = auVar23._0_2_;
  sVar36 = -sVar14;
  sVar16 = auVar23._2_2_;
  sVar41 = -sVar16;
  sVar17 = auVar23._4_2_;
  sVar2 = -sVar17;
  sVar18 = auVar23._6_2_;
  sVar3 = -sVar18;
  sVar19 = auVar23._8_2_;
  sVar4 = -sVar19;
  sVar20 = auVar23._10_2_;
  sVar5 = -sVar20;
  sVar21 = auVar23._12_2_;
  sVar6 = -sVar21;
  sVar22 = auVar23._14_2_;
  sVar7 = -sVar22;
  auVar39._0_2_ = (ushort)(sVar36 < sVar14) * sVar14 | (ushort)(sVar36 >= sVar14) * sVar36;
  auVar39._2_2_ = (ushort)(sVar41 < sVar16) * sVar16 | (ushort)(sVar41 >= sVar16) * sVar41;
  auVar39._4_2_ = (ushort)(sVar2 < sVar17) * sVar17 | (ushort)(sVar2 >= sVar17) * sVar2;
  auVar39._6_2_ = (ushort)(sVar3 < sVar18) * sVar18 | (ushort)(sVar3 >= sVar18) * sVar3;
  auVar39._8_2_ = (ushort)(sVar4 < sVar19) * sVar19 | (ushort)(sVar4 >= sVar19) * sVar4;
  auVar39._10_2_ = (ushort)(sVar5 < sVar20) * sVar20 | (ushort)(sVar5 >= sVar20) * sVar5;
  auVar39._12_2_ = (ushort)(sVar6 < sVar21) * sVar21 | (ushort)(sVar6 >= sVar21) * sVar6;
  auVar39._14_2_ = (ushort)(sVar7 < sVar22) * sVar22 | (ushort)(sVar7 >= sVar22) * sVar7;
  auVar23 = psraw(auVar23,0xf);
  auVar43 = pmulhuw(auVar30,auVar25);
  sVar36 = auVar30._6_2_ * auVar25._6_2_;
  auVar24 = pmulhuw(auVar39,auVar33);
  sVar41 = auVar39._6_2_ * auVar33._6_2_;
  iVar12 = CONCAT22(auVar43._6_2_,sVar36);
  Var10 = CONCAT64(CONCAT42(iVar12,auVar43._4_2_),CONCAT22(auVar30._4_2_ * auVar25._4_2_,sVar36));
  auVar8._4_8_ = (long)((unkuint10)Var10 >> 0x10);
  auVar8._2_2_ = auVar43._2_2_;
  auVar8._0_2_ = auVar30._2_2_ * auVar25._2_2_;
  iVar28 = CONCAT22(auVar43._8_2_,auVar30._8_2_ * auVar25._8_2_);
  auVar29._0_8_ = CONCAT26(auVar43._10_2_,CONCAT24(auVar30._10_2_ * auVar25._10_2_,iVar28));
  auVar29._8_2_ = auVar30._12_2_ * auVar25._12_2_;
  auVar29._10_2_ = auVar43._12_2_;
  auVar31._12_2_ = auVar30._14_2_ * auVar25._14_2_;
  auVar31._0_12_ = auVar29;
  auVar31._14_2_ = auVar43._14_2_;
  iVar13 = CONCAT22(auVar24._6_2_,sVar41);
  Var11 = CONCAT64(CONCAT42(iVar13,auVar24._4_2_),CONCAT22(auVar39._4_2_ * auVar33._4_2_,sVar41));
  auVar9._4_8_ = (long)((unkuint10)Var11 >> 0x10);
  auVar9._2_2_ = auVar24._2_2_;
  auVar9._0_2_ = auVar39._2_2_ * auVar33._2_2_;
  iVar37 = CONCAT22(auVar24._8_2_,auVar39._8_2_ * auVar33._8_2_);
  auVar38._0_8_ = CONCAT26(auVar24._10_2_,CONCAT24(auVar39._10_2_ * auVar33._10_2_,iVar37));
  auVar38._8_2_ = auVar39._12_2_ * auVar33._12_2_;
  auVar38._10_2_ = auVar24._12_2_;
  auVar40._12_2_ = auVar39._14_2_ * auVar33._14_2_;
  auVar40._0_12_ = auVar38;
  auVar40._14_2_ = auVar24._14_2_;
  auVar43._0_4_ =
       (int)(mtx->bias_[0] + CONCAT22(auVar43._0_2_,auVar30._0_2_ * auVar25._0_2_)) >> 0x11;
  auVar43._4_4_ = (int)(mtx->bias_[1] + auVar8._0_4_) >> 0x11;
  auVar43._8_4_ = (int)(mtx->bias_[2] + (int)((unkuint10)Var10 >> 0x10)) >> 0x11;
  auVar43._12_4_ = (int)(mtx->bias_[3] + iVar12) >> 0x11;
  auVar42._0_4_ = (int)(mtx->bias_[4] + iVar28) >> 0x11;
  auVar42._4_4_ = (int)(mtx->bias_[5] + (int)((ulong)auVar29._0_8_ >> 0x20)) >> 0x11;
  auVar42._8_4_ = (int)(mtx->bias_[6] + auVar29._8_4_) >> 0x11;
  auVar42._12_4_ = (int)(mtx->bias_[7] + auVar31._12_4_) >> 0x11;
  auVar25 = packssdw(auVar43,auVar42);
  auVar32._0_4_ =
       (int)(mtx->bias_[8] + CONCAT22(auVar24._0_2_,auVar39._0_2_ * auVar33._0_2_)) >> 0x11;
  auVar32._4_4_ = (int)(mtx->bias_[9] + auVar9._0_4_) >> 0x11;
  auVar32._8_4_ = (int)(mtx->bias_[10] + (int)((unkuint10)Var11 >> 0x10)) >> 0x11;
  auVar32._12_4_ = (int)(mtx->bias_[0xb] + iVar13) >> 0x11;
  auVar44._0_4_ = (int)(mtx->bias_[0xc] + iVar37) >> 0x11;
  auVar44._4_4_ = (int)(mtx->bias_[0xd] + (int)((ulong)auVar38._0_8_ >> 0x20)) >> 0x11;
  auVar44._8_4_ = (int)(mtx->bias_[0xe] + auVar38._8_4_) >> 0x11;
  auVar44._12_4_ = (int)(mtx->bias_[0xf] + auVar40._12_4_) >> 0x11;
  auVar33 = packssdw(auVar32,auVar44);
  sVar36 = auVar25._0_2_;
  auVar26._0_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._2_2_;
  auVar26._2_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._4_2_;
  auVar26._4_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._6_2_;
  auVar26._6_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._8_2_;
  auVar26._8_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._10_2_;
  auVar26._10_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar25._12_2_;
  sVar41 = auVar25._14_2_;
  auVar26._12_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  auVar26._14_2_ = (ushort)(0x7ff < sVar41) * 0x7ff | (ushort)(0x7ff >= sVar41) * sVar41;
  sVar36 = auVar33._0_2_;
  auVar34._0_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._2_2_;
  auVar34._2_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._4_2_;
  auVar34._4_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._6_2_;
  auVar34._6_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._8_2_;
  auVar34._8_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._10_2_;
  auVar34._10_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  sVar36 = auVar33._12_2_;
  sVar41 = auVar33._14_2_;
  auVar34._12_2_ = (ushort)(0x7ff < sVar36) * 0x7ff | (ushort)(0x7ff >= sVar36) * sVar36;
  auVar34._14_2_ = (ushort)(0x7ff < sVar41) * 0x7ff | (ushort)(0x7ff >= sVar41) * sVar41;
  auVar26 = auVar26 ^ auVar15;
  auVar34 = auVar34 ^ auVar23;
  auVar27._0_2_ = auVar26._0_2_ - auVar15._0_2_;
  auVar27._2_2_ = auVar26._2_2_ - auVar15._2_2_;
  auVar27._4_2_ = auVar26._4_2_ - auVar15._4_2_;
  auVar27._6_2_ = auVar26._6_2_ - auVar15._6_2_;
  auVar27._8_2_ = auVar26._8_2_ - auVar15._8_2_;
  auVar27._10_2_ = auVar26._10_2_ - auVar15._10_2_;
  auVar27._12_2_ = auVar26._12_2_ - auVar15._12_2_;
  auVar27._14_2_ = auVar26._14_2_ - auVar15._14_2_;
  auVar35._0_2_ = auVar34._0_2_ - auVar23._0_2_;
  auVar35._2_2_ = auVar34._2_2_ - auVar23._2_2_;
  auVar35._4_2_ = auVar34._4_2_ - auVar23._4_2_;
  auVar35._6_2_ = auVar34._6_2_ - auVar23._6_2_;
  auVar35._8_2_ = auVar34._8_2_ - auVar23._8_2_;
  auVar35._10_2_ = auVar34._10_2_ - auVar23._10_2_;
  auVar35._12_2_ = auVar34._12_2_ - auVar23._12_2_;
  auVar35._14_2_ = auVar34._14_2_ - auVar23._14_2_;
  auVar15._0_2_ = mtx->q_[0] * auVar27._0_2_;
  auVar15._2_2_ = mtx->q_[1] * auVar27._2_2_;
  auVar15._4_2_ = mtx->q_[2] * auVar27._4_2_;
  auVar15._6_2_ = mtx->q_[3] * auVar27._6_2_;
  auVar15._8_2_ = mtx->q_[4] * auVar27._8_2_;
  auVar15._10_2_ = mtx->q_[5] * auVar27._10_2_;
  auVar15._12_2_ = mtx->q_[6] * auVar27._12_2_;
  auVar15._14_2_ = mtx->q_[7] * auVar27._14_2_;
  auVar33._0_2_ = mtx->q_[8] * auVar35._0_2_;
  auVar33._2_2_ = mtx->q_[9] * auVar35._2_2_;
  auVar33._4_2_ = mtx->q_[10] * auVar35._4_2_;
  auVar33._6_2_ = mtx->q_[0xb] * auVar35._6_2_;
  auVar33._8_2_ = mtx->q_[0xc] * auVar35._8_2_;
  auVar33._10_2_ = mtx->q_[0xd] * auVar35._10_2_;
  auVar33._12_2_ = mtx->q_[0xe] * auVar35._12_2_;
  auVar33._14_2_ = mtx->q_[0xf] * auVar35._14_2_;
  *(undefined1 (*) [16])in = auVar15;
  *(undefined1 (*) [16])(in + 8) = auVar33;
  auVar15 = pshufhw(auVar15,auVar27,0xc6);
  auVar23._0_4_ = auVar15._0_4_;
  auVar23._8_4_ = auVar15._8_4_;
  auVar23._4_4_ = auVar15._12_4_;
  auVar23._12_4_ = auVar15._4_4_;
  auVar15 = pshufhw(auVar23,auVar23,0x39);
  auVar23 = pshuflw(auVar33,auVar35,0xc6);
  auVar24._0_4_ = auVar23._0_4_;
  auVar24._12_4_ = auVar23._12_4_;
  auVar24._4_4_ = auVar23._8_4_;
  auVar24._8_4_ = auVar23._4_4_;
  auVar23 = pshuflw(auVar24,auVar24,0x39);
  *(undefined1 (*) [16])out = auVar15;
  *(undefined1 (*) [16])(out + 8) = auVar23;
  auVar15 = packsswb(auVar15,auVar23);
  iVar1 = out[3];
  out[3] = out[0xc];
  out[0xc] = iVar1;
  auVar25[0] = -(auVar15[0] == '\0');
  auVar25[1] = -(auVar15[1] == '\0');
  auVar25[2] = -(auVar15[2] == '\0');
  auVar25[3] = -(auVar15[3] == '\0');
  auVar25[4] = -(auVar15[4] == '\0');
  auVar25[5] = -(auVar15[5] == '\0');
  auVar25[6] = -(auVar15[6] == '\0');
  auVar25[7] = -(auVar15[7] == '\0');
  auVar25[8] = -(auVar15[8] == '\0');
  auVar25[9] = -(auVar15[9] == '\0');
  auVar25[10] = -(auVar15[10] == '\0');
  auVar25[0xb] = -(auVar15[0xb] == '\0');
  auVar25[0xc] = -(auVar15[0xc] == '\0');
  auVar25[0xd] = -(auVar15[0xd] == '\0');
  auVar25[0xe] = -(auVar15[0xe] == '\0');
  auVar25[0xf] = -(auVar15[0xf] == '\0');
  return (int)((ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar25[0xf] >> 7) << 0xf) != 0xffff);
}

Assistant:

static WEBP_INLINE int DoQuantizeBlock_SSE2(
    int16_t in[16], int16_t out[16],
    const uint16_t* WEBP_RESTRICT const sharpen,
    const VP8Matrix* WEBP_RESTRICT const mtx) {
  const __m128i max_coeff_2047 = _mm_set1_epi16(MAX_LEVEL);
  const __m128i zero = _mm_setzero_si128();
  __m128i coeff0, coeff8;
  __m128i out0, out8;
  __m128i packed_out;

  // Load all inputs.
  __m128i in0 = _mm_loadu_si128((__m128i*)&in[0]);
  __m128i in8 = _mm_loadu_si128((__m128i*)&in[8]);
  const __m128i iq0 = _mm_loadu_si128((const __m128i*)&mtx->iq_[0]);
  const __m128i iq8 = _mm_loadu_si128((const __m128i*)&mtx->iq_[8]);
  const __m128i q0 = _mm_loadu_si128((const __m128i*)&mtx->q_[0]);
  const __m128i q8 = _mm_loadu_si128((const __m128i*)&mtx->q_[8]);

  // extract sign(in)  (0x0000 if positive, 0xffff if negative)
  const __m128i sign0 = _mm_cmpgt_epi16(zero, in0);
  const __m128i sign8 = _mm_cmpgt_epi16(zero, in8);

  // coeff = abs(in) = (in ^ sign) - sign
  coeff0 = _mm_xor_si128(in0, sign0);
  coeff8 = _mm_xor_si128(in8, sign8);
  coeff0 = _mm_sub_epi16(coeff0, sign0);
  coeff8 = _mm_sub_epi16(coeff8, sign8);

  // coeff = abs(in) + sharpen
  if (sharpen != NULL) {
    const __m128i sharpen0 = _mm_loadu_si128((const __m128i*)&sharpen[0]);
    const __m128i sharpen8 = _mm_loadu_si128((const __m128i*)&sharpen[8]);
    coeff0 = _mm_add_epi16(coeff0, sharpen0);
    coeff8 = _mm_add_epi16(coeff8, sharpen8);
  }

  // out = (coeff * iQ + B) >> QFIX
  {
    // doing calculations with 32b precision (QFIX=17)
    // out = (coeff * iQ)
    const __m128i coeff_iQ0H = _mm_mulhi_epu16(coeff0, iq0);
    const __m128i coeff_iQ0L = _mm_mullo_epi16(coeff0, iq0);
    const __m128i coeff_iQ8H = _mm_mulhi_epu16(coeff8, iq8);
    const __m128i coeff_iQ8L = _mm_mullo_epi16(coeff8, iq8);
    __m128i out_00 = _mm_unpacklo_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_04 = _mm_unpackhi_epi16(coeff_iQ0L, coeff_iQ0H);
    __m128i out_08 = _mm_unpacklo_epi16(coeff_iQ8L, coeff_iQ8H);
    __m128i out_12 = _mm_unpackhi_epi16(coeff_iQ8L, coeff_iQ8H);
    // out = (coeff * iQ + B)
    const __m128i bias_00 = _mm_loadu_si128((const __m128i*)&mtx->bias_[0]);
    const __m128i bias_04 = _mm_loadu_si128((const __m128i*)&mtx->bias_[4]);
    const __m128i bias_08 = _mm_loadu_si128((const __m128i*)&mtx->bias_[8]);
    const __m128i bias_12 = _mm_loadu_si128((const __m128i*)&mtx->bias_[12]);
    out_00 = _mm_add_epi32(out_00, bias_00);
    out_04 = _mm_add_epi32(out_04, bias_04);
    out_08 = _mm_add_epi32(out_08, bias_08);
    out_12 = _mm_add_epi32(out_12, bias_12);
    // out = QUANTDIV(coeff, iQ, B, QFIX)
    out_00 = _mm_srai_epi32(out_00, QFIX);
    out_04 = _mm_srai_epi32(out_04, QFIX);
    out_08 = _mm_srai_epi32(out_08, QFIX);
    out_12 = _mm_srai_epi32(out_12, QFIX);

    // pack result as 16b
    out0 = _mm_packs_epi32(out_00, out_04);
    out8 = _mm_packs_epi32(out_08, out_12);

    // if (coeff > 2047) coeff = 2047
    out0 = _mm_min_epi16(out0, max_coeff_2047);
    out8 = _mm_min_epi16(out8, max_coeff_2047);
  }

  // get sign back (if (sign[j]) out_n = -out_n)
  out0 = _mm_xor_si128(out0, sign0);
  out8 = _mm_xor_si128(out8, sign8);
  out0 = _mm_sub_epi16(out0, sign0);
  out8 = _mm_sub_epi16(out8, sign8);

  // in = out * Q
  in0 = _mm_mullo_epi16(out0, q0);
  in8 = _mm_mullo_epi16(out8, q8);

  _mm_storeu_si128((__m128i*)&in[0], in0);
  _mm_storeu_si128((__m128i*)&in[8], in8);

  // zigzag the output before storing it.
  //
  // The zigzag pattern can almost be reproduced with a small sequence of
  // shuffles. After it, we only need to swap the 7th (ending up in third
  // position instead of twelfth) and 8th values.
  {
    __m128i outZ0, outZ8;
    outZ0 = _mm_shufflehi_epi16(out0,  _MM_SHUFFLE(2, 1, 3, 0));
    outZ0 = _mm_shuffle_epi32  (outZ0, _MM_SHUFFLE(3, 1, 2, 0));
    outZ0 = _mm_shufflehi_epi16(outZ0, _MM_SHUFFLE(3, 1, 0, 2));
    outZ8 = _mm_shufflelo_epi16(out8,  _MM_SHUFFLE(3, 0, 2, 1));
    outZ8 = _mm_shuffle_epi32  (outZ8, _MM_SHUFFLE(3, 1, 2, 0));
    outZ8 = _mm_shufflelo_epi16(outZ8, _MM_SHUFFLE(1, 3, 2, 0));
    _mm_storeu_si128((__m128i*)&out[0], outZ0);
    _mm_storeu_si128((__m128i*)&out[8], outZ8);
    packed_out = _mm_packs_epi16(outZ0, outZ8);
  }
  {
    const int16_t outZ_12 = out[12];
    const int16_t outZ_3 = out[3];
    out[3] = outZ_12;
    out[12] = outZ_3;
  }

  // detect if all 'out' values are zeroes or not
  return (_mm_movemask_epi8(_mm_cmpeq_epi8(packed_out, zero)) != 0xffff);
}